

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cpp
# Opt level: O3

void __thiscall xscript::parser::ast::next(ast *this)

{
  scanner *this_00;
  undefined4 uVar1;
  undefined1 auVar2 [8];
  token_t_conflict tVar3;
  size_t sVar4;
  bool bVar5;
  token local_60;
  undefined1 auStack_48 [8];
  token token;
  
  this_00 = &this->scanner;
  do {
    tokenizer::scanner::next((token *)auStack_48,this_00);
    tVar3 = auStack_48._0_4_;
    auVar2 = auStack_48;
    switch(auStack_48._0_4_) {
    case 1:
      if ((this->cur_token).type != TK_EOF) {
switchD_00116af9_caseD_5:
        (this->prev_token).literal._M_str = (this->cur_token).literal._M_str;
        uVar1 = *(undefined4 *)&(this->cur_token).field_0x4;
        sVar4 = (this->cur_token).literal._M_len;
        (this->prev_token).type = (this->cur_token).type;
        *(undefined4 *)&(this->prev_token).field_0x4 = uVar1;
        (this->prev_token).literal._M_len = sVar4;
        *(undefined1 (*) [8])&this->cur_token = auStack_48;
        (this->cur_token).literal._M_len = token._0_8_;
        (this->cur_token).literal._M_str = (char *)token.literal._M_len;
      }
      return;
    case 2:
      this->line = this->line + 1;
      sVar4 = tokenizer::scanner::get_offset(this_00);
      this->line_offset = sVar4;
      break;
    case 3:
      do {
        tokenizer::scanner::next(&local_60,this_00);
        token.literal._M_len = (size_t)local_60.literal._M_str;
        auStack_48 = (undefined1  [8])local_60._0_8_;
        auVar2 = auStack_48;
        token._0_8_ = local_60.literal._M_len;
        auStack_48._0_4_ = local_60.type;
        bVar5 = auStack_48._0_4_ == TK_EOL;
        tVar3 = auStack_48._0_4_;
        auStack_48 = auVar2;
        if (bVar5) {
          this->line = this->line + 1;
          sVar4 = tokenizer::scanner::get_offset(this_00);
          this->line_offset = sVar4;
          tVar3 = auStack_48._0_4_;
        }
      } while (1 < tVar3 - TK_EOF);
      break;
    case 4:
      while (auStack_48 = auVar2, (tVar3 | TK_COMMENT_BEGIN) != TK_COMMENT_END) {
        tokenizer::scanner::next(&local_60,this_00);
        token.literal._M_len = (size_t)local_60.literal._M_str;
        auStack_48 = (undefined1  [8])local_60._0_8_;
        auVar2 = auStack_48;
        token._0_8_ = local_60.literal._M_len;
        auStack_48._0_4_ = local_60.type;
        tVar3 = auStack_48._0_4_;
        if (auStack_48._0_4_ == TK_EOL) {
          this->line = this->line + 1;
          auStack_48 = auVar2;
          sVar4 = tokenizer::scanner::get_offset(this_00);
          this->line_offset = sVar4;
          tVar3 = auStack_48._0_4_;
          auVar2 = auStack_48;
        }
      }
      break;
    default:
      goto switchD_00116af9_caseD_5;
    case 6:
    case 7:
      break;
    }
  } while( true );
}

Assistant:

void ast::next() {
    while (true) {
        tokenizer::token token = scanner.next();
        switch (token.type) {
            case tokenizer::TK_SPACE:
            case tokenizer::TK_TAB:
                // 忽略空格与制表符
                break;
            case tokenizer::TK_COMMENT_LINE:
                // 跳过单行注释
                while (token != tokenizer::TK_EOF && token != tokenizer::TK_EOL) {
                    token = scanner.next();
                    if (token == tokenizer::TK_EOL) {
                        next_line();
                    }
                }
                break;
            case tokenizer::TK_COMMENT_BEGIN:
                // 跳过多行注释
                while (token != tokenizer::TK_EOF && token != tokenizer::TK_COMMENT_END) {
                    token = scanner.next();
                    if (token == tokenizer::TK_EOL) {
                        next_line();
                    }
                }
                break;
            case tokenizer::TK_EOL:
                // 忽略换行
                next_line();
                break;
            case tokenizer::TK_EOF:
                // 扫描结束
                if (cur_token == tokenizer::TK_EOF) {
                    return;
                }
            default:
                prev_token = cur_token;
                cur_token = token;
                return;
        }
    }
}